

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

int checkivError(GLuint object,GLenum pname,PFNGLGETPROGRAMIVPROC glGetiv,
                PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)

{
  bool bVar1;
  void *pvVar2;
  int in_EAX;
  int iVar3;
  GLchar *__ptr;
  long lVar4;
  bool bVar5;
  char *fmt;
  GLint logsize;
  GLint compile_status;
  int local_38;
  GLint local_34;
  
  local_34 = 1;
  local_38 = in_EAX;
  (*glGetiv)(object,pname,&local_34);
  iVar3 = 0;
  if (local_34 != 1) {
    (*glGetiv)(object,0x8b84,&local_38);
    __ptr = (GLchar *)malloc((long)local_38 + 1);
    if (__ptr == (GLchar *)0x0) {
      checkivError_cold_1();
      lVar4 = 0;
      bVar5 = true;
      pvVar2 = libGL;
      while (libGL = pvVar2,
            libGL = (void *)dlopen((long)&open_gl_NAMES_rel + (long)(int)(&open_gl_NAMES_rel)[lVar4]
                                   ,0x102), libGL == (void *)0x0) {
        lVar4 = 1;
        bVar1 = !bVar5;
        bVar5 = false;
        pvVar2 = (void *)0x0;
        if (bVar1) {
          return 0;
        }
      }
      gladGetProcAddressPtr = (PFNGLXGETPROCADDRESSPROC_PRIVATE)dlsym(libGL,"glXGetProcAddressARB");
      if (gladGetProcAddressPtr == (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
        return 0;
      }
      iVar3 = gladLoadGLLoader(get_proc);
      if (libGL == (void *)0x0) {
        return iVar3;
      }
      dlclose();
      libGL = (void *)0x0;
      return iVar3;
    }
    (*glGetInfoLog)(object,local_38,&local_38,__ptr);
    fmt = "%s\t-> compile operation failed";
    if (pname == 0x8b82) {
      fmt = "%s\t-> link operation failed";
    }
    iVar3 = 0x20002;
    bov_error_log(0x20002,fmt,__ptr);
    fprintf(_stderr,"\t(in function %s, line %d)\n","checkivError",
            (ulong)((uint)(pname != 0x8b82) * 4 + 0x83));
    free(__ptr);
  }
  return iVar3;
}

Assistant:

static int checkivError(GLuint object, GLenum pname,
                        PFNGLGETPROGRAMIVPROC glGetiv,
                        PFNGLGETPROGRAMINFOLOGPROC glGetInfoLog)
{
	GLint compile_status = GL_TRUE;
	glGetiv(object, pname, &compile_status);
	if(compile_status!=GL_TRUE)
	{
		GLint logsize;
		glGetiv(object, GL_INFO_LOG_LENGTH, &logsize);

		char *log = malloc((size_t) logsize + 1);
		CHECK_MALLOC(log);

		glGetInfoLog(object, logsize, &logsize, log);
		if(pname==GL_LINK_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> link operation failed",
			              log);
		else if(pname==GL_COMPILE_STATUS)
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> compile operation failed",
			              log);
		else
			BOV_ERROR_LOG(BOV_SHADER_ERROR,
			              "%s\t-> Unknown object operation failed",
			              log);
		free(log);
		return BOV_SHADER_ERROR;
	}
	return 0;
}